

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

json_t * parse_json(lex_t *lex,size_t flags,json_error_t *error)

{
  json_t *json;
  size_t sVar1;
  
  lex->depth = 0;
  lex_scan(lex,error);
  if (((flags & 4) == 0) && ((lex->token | 0x20U) != 0x7b)) {
    error_set(error,lex,"\'[\' or \'{\' expected");
    return (json_t *)0x0;
  }
  json = parse_value(lex,flags,error);
  if (json != (json_t *)0x0) {
    if (((flags & 2) != 0) || (lex_scan(lex,error), lex->token == 0)) {
      if (error == (json_error_t *)0x0) {
        return json;
      }
      error->position = (int)(lex->stream).position;
      return json;
    }
    error_set(error,lex,"end of file expected");
    if ((json->refcount != 0xffffffffffffffff) &&
       (sVar1 = json->refcount - 1, json->refcount = sVar1, sVar1 == 0)) {
      json_delete(json);
    }
  }
  return (json_t *)0x0;
}

Assistant:

static json_t *parse_json(lex_t *lex, size_t flags, json_error_t *error)
{
	json_t *result;

	lex->depth = 0;

	lex_scan(lex, error);
	if (!(flags & JSON_DECODE_ANY)) {
		if (lex->token != '[' && lex->token != '{') {
			error_set(error, lex, "'[' or '{' expected");
			return NULL;
		}
	}

	result = parse_value(lex, flags, error);
	if (!result)
		return NULL;

	if (!(flags & JSON_DISABLE_EOF_CHECK)) {
		lex_scan(lex, error);
		if (lex->token != TOKEN_EOF) {
			error_set(error, lex, "end of file expected");
			json_decref(result);
			return NULL;
		}
	}

	if (error) {
		/* Save the position even though there was no error */
		error->position = (int)lex->stream.position;
	}

	return result;
}